

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O3

void __thiscall
ShadingPass::execute
          (ShadingPass *this,mat4 viewMatrix,mat4 projMatrix,float zNear,float zFar,vec3 lightDir,
          mat4 lightMatrix,Cubemap *cubemap,uint albedo_tex,uint normal_tex,uint shadow_tex,
          uint rough_met_tex,uint position_tex,uint ssao_tex,Cubemap *irradiance,uint vao)

{
  Shader *pSVar1;
  ulong uVar2;
  Block *pBVar3;
  GpuCtx *pGVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  ExplicitProducer *pEVar9;
  ExplicitProducer *extraout_RAX;
  GpuCtxWrapper *pGVar10;
  ExplicitProducer *extraout_RAX_00;
  ExplicitProducer *extraout_RAX_01;
  ExplicitProducer *extraout_RAX_02;
  ExplicitProducer *pEVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b0 [48];
  undefined8 local_80;
  float local_78;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_70;
  undefined8 local_60;
  float local_58;
  undefined4 local_54;
  undefined8 local_50;
  float local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  local_c8._8_4_ = in_XMM2_Dc;
  local_c8._0_8_ = lightDir.field_0._0_8_;
  local_c8._12_4_ = in_XMM2_Dd;
  pEVar9 = tracy::GetToken();
  uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar11 = pEVar9;
  if ((uVar2 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
    pEVar11 = extraout_RAX;
  }
  pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
  uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar13] = '\x0f';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar13 + 9) =
       &execute::__tracy_source_location451;
  (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  pGVar10 = tracy::GetGpuCtx();
  pGVar4 = pGVar10->ptr;
  uVar8 = pGVar4->m_head;
  uVar12 = uVar8 + 1 & 0xffff;
  pGVar4->m_head = uVar12;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar12 == pGVar4->m_tail) goto LAB_00303e57;
  pGVar10 = tracy::GetGpuCtx();
  (*(code *)uVar6)((ulong)pGVar10->ptr->m_query[uVar8],0x8e28);
  pEVar9 = tracy::GetToken();
  uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar11 = pEVar9;
  if ((uVar2 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
    pEVar11 = extraout_RAX_00;
  }
  pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
  uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar13] = '!';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
  *(undefined4 *)((long)&pBVar3->field_0 + uVar13 + 9) = 0;
  *(short *)((long)&pBVar3->field_0 + uVar13 + 0xd) = (short)uVar8;
  pGVar10 = tracy::GetGpuCtx();
  (pBVar3->field_0).elements[uVar13 + 0xf] = pGVar10->ptr->m_context;
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar13 + 0x10) =
       &execute::__tracy_gpu_source_location452;
  (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  (*gl3wProcs.ptr[0x1b0])(0x824a,0,0xffffffff,"Shading pass");
  (*gl3wProcs.ptr[0x179])();
  (*gl3wProcs.ptr[0xf])(0x8d40);
  (*gl3wProcs.ptr[0x2e])(0x4000);
  if (this->skybox_choice == 0) {
    if (cubemap != (Cubemap *)0x0) goto LAB_00302e0d;
  }
  else {
    cubemap = irradiance;
    if (this->skybox_choice != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/src/renderer.cpp"
                    ,0x1d4,
                    "void ShadingPass::execute(glm::mat4, glm::mat4, float, float, glm::vec3, glm::mat4, Cubemap *, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, const Cubemap &, unsigned int)"
                   );
    }
LAB_00302e0d:
    (*gl3wProcs.ptr[0x1a])((ulong)this->cube_vao);
    uVar6 = gl3wProcs.ptr[0x22f];
    pSVar1 = &this->skybox_program;
    uVar8 = Shader::id(pSVar1);
    (*(code *)uVar6)((ulong)uVar8);
    uVar6 = gl3wProcs.ptr[0x227];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"viewproj","");
    uVar8 = Shader::getLoc(pSVar1,&local_e8);
    local_70._0_8_ = viewMatrix.value[0].field_0._0_8_;
    local_70.field_0.z = viewMatrix.value[0].field_0.field_0.z;
    local_70.field_0.w = 0.0;
    local_60 = viewMatrix.value[1].field_0._0_8_;
    local_58 = viewMatrix.value[1].field_0.field_0.z;
    local_54 = 0;
    local_50 = viewMatrix.value[2].field_0._0_8_;
    local_48 = viewMatrix.value[2].field_0.field_0.z;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0x3f800000;
    glm::operator*(&projMatrix,(tmat4x4<float,_(glm::precision)0> *)&local_70.field_0);
    (*(code *)uVar6)((ulong)uVar8,1,0,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    uVar6 = gl3wProcs.ptr[0x1fb];
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"scale","");
    uVar8 = Shader::getLoc(pSVar1,&local_108);
    (*(code *)uVar6)((zNear + zFar) * 0.5,(ulong)uVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    (*gl3wProcs.ptr[1])(0x84c0);
    uVar6 = gl3wProcs.ptr[0x16];
    uVar8 = Cubemap::id(cubemap);
    (*(code *)uVar6)(0x8513,(ulong)uVar8);
    uVar6 = gl3wProcs.ptr[0x1fd];
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"skybox","");
    uVar8 = Shader::getLoc(pSVar1,&local_128);
    (*(code *)uVar6)((ulong)uVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    (*gl3wProcs.ptr[0x83])(4,0,0x24);
  }
  bVar7 = ImGui::CollapsingHeader("Point light",0);
  if (bVar7) {
    ImGui::ColorEdit3("Light color",execute::lightColor,0);
    ImGui::DragFloat3("Light position",execute::lightPos,0.001,-10.0,10.0,"%.3f",1.0);
    ImGui::Separator();
  }
  uVar6 = gl3wProcs.ptr[0x22f];
  pSVar1 = &this->shading_program;
  uVar8 = Shader::id(pSVar1);
  (*(code *)uVar6)((ulong)uVar8);
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"pointLightsNum","");
  uVar8 = Shader::getLoc(pSVar1,&local_148);
  (*(code *)uVar6)((ulong)uVar8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x20c];
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pointLights[0].position","")
  ;
  uVar8 = Shader::getLoc(pSVar1,&local_168);
  (*(code *)uVar6)((ulong)uVar8,1,execute::lightPos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x20c];
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"pointLights[0].color","");
  uVar8 = Shader::getLoc(pSVar1,&local_188);
  (*(code *)uVar6)((ulong)uVar8,1,execute::lightColor);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  glm::detail::compute_inverse<glm::tmat4x4,_float,_(glm::precision)0,_false>::call(&viewMatrix);
  uVar6 = gl3wProcs.ptr[0x20c];
  local_70._0_8_ = local_80;
  local_70.field_0.z = local_78;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"camPos","");
  uVar8 = Shader::getLoc(pSVar1,&local_1a8);
  (*(code *)uVar6)((ulong)uVar8,1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"albedotex","");
  uVar8 = Shader::getLoc(pSVar1,&local_1c8);
  (*(code *)uVar6)((ulong)uVar8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"normaltex","");
  uVar8 = Shader::getLoc(pSVar1,&local_1e8);
  (*(code *)uVar6)((ulong)uVar8,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"depthtex","");
  uVar8 = Shader::getLoc(pSVar1,&local_208);
  (*(code *)uVar6)((ulong)uVar8,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"roughmettex","");
  uVar8 = Shader::getLoc(pSVar1,&local_228);
  (*(code *)uVar6)((ulong)uVar8,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"positiontex","");
  uVar8 = Shader::getLoc(pSVar1,&local_248);
  (*(code *)uVar6)((ulong)uVar8,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ssaotex","");
  uVar8 = Shader::getLoc(pSVar1,&local_268);
  (*(code *)uVar6)((ulong)uVar8,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fd];
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"irradianceMap","");
  uVar8 = Shader::getLoc(pSVar1,&local_288);
  (*(code *)uVar6)((ulong)uVar8,6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x20b];
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"sunLight.dir","");
  uVar8 = Shader::getLoc(pSVar1,&local_2a8);
  (*(code *)uVar6)(local_c8._0_4_,local_c8._4_4_,lightDir.field_0._8_4_,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x20b];
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"sunLight.color","");
  uVar8 = Shader::getLoc(pSVar1,&local_2c8);
  (*(code *)uVar6)(0x3f800000,0x3f800000,0x3f800000,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x227];
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"lightSpaceMatrix","");
  uVar8 = Shader::getLoc(pSVar1,&local_2e8);
  (*(code *)uVar6)((ulong)uVar8,1,0,&lightMatrix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fb];
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ambientIntensity","");
  uVar8 = Shader::getLoc(pSVar1,&local_308);
  (*(code *)uVar6)(this->ambient_intensity,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fb];
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"shadowBias","");
  uVar8 = Shader::getLoc(pSVar1,&local_328);
  (*(code *)uVar6)(this->shadow_bias,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fb];
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"use_pcf","");
  uVar8 = Shader::getLoc(pSVar1,&local_348);
  (*(code *)uVar6)((float)(int)this->use_pcf,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1ff];
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"frame_num","");
  uVar8 = Shader::getLoc(pSVar1,&local_368);
  (*(code *)uVar6)((ulong)uVar8,(ulong)this->frame_num);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  uVar6 = gl3wProcs.ptr[0x1fb];
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"pcf_radius","");
  uVar8 = Shader::getLoc(pSVar1,&local_388);
  (*(code *)uVar6)(this->pcf_radius,(ulong)uVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  (*gl3wProcs.ptr[1])(0x84c0);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)albedo_tex);
  (*gl3wProcs.ptr[1])(0x84c1);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)normal_tex);
  (*gl3wProcs.ptr[1])(0x84c2);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)shadow_tex);
  (*gl3wProcs.ptr[1])(0x84c3);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)rough_met_tex);
  (*gl3wProcs.ptr[1])(0x84c4);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)position_tex);
  (*gl3wProcs.ptr[1])(0x84c5);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)ssao_tex);
  (*gl3wProcs.ptr[1])(0x84c6);
  uVar6 = gl3wProcs.ptr[0x16];
  uVar8 = Cubemap::id(irradiance);
  (*(code *)uVar6)(0x8513,(ulong)uVar8);
  (*gl3wProcs.ptr[0x1a])((ulong)vao);
  (*gl3wProcs.ptr[0x83])(4,0,3);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  this->frame_num = this->frame_num + 1;
  pGVar10 = tracy::GetGpuCtx();
  pGVar4 = pGVar10->ptr;
  uVar8 = pGVar4->m_head;
  uVar12 = uVar8 + 1 & 0xffff;
  pGVar4->m_head = uVar12;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar12 != pGVar4->m_tail) {
    pGVar10 = tracy::GetGpuCtx();
    (*(code *)uVar6)((ulong)pGVar10->ptr->m_query[uVar8],0x8e28);
    pEVar9 = tracy::GetToken();
    uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar11 = pEVar9;
    if ((uVar2 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
      pEVar11 = extraout_RAX_01;
    }
    pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
    uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
    (pBVar3->field_0).elements[uVar13] = '%';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
    *(undefined4 *)((long)&pBVar3->field_0 + uVar13 + 9) = 0;
    *(short *)((long)&pBVar3->field_0 + uVar13 + 0xd) = (short)uVar8;
    pGVar10 = tracy::GetGpuCtx();
    (pBVar3->field_0).elements[uVar13 + 0xf] = pGVar10->ptr->m_context;
    (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
    pEVar9 = tracy::GetToken();
    uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar11 = pEVar9;
    if ((uVar2 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
      pEVar11 = extraout_RAX_02;
    }
    pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
    uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
    (pBVar3->field_0).elements[uVar13] = '\x11';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
    (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
    return;
  }
LAB_00303e57:
  __assert_fail("m_head != m_tail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
}

Assistant:

void ShadingPass::execute(glm::mat4 viewMatrix, glm::mat4 projMatrix, float zNear, float zFar, glm::vec3 lightDir, glm::mat4 lightMatrix, Cubemap* cubemap, unsigned int albedo_tex, unsigned int normal_tex, unsigned int shadow_tex, unsigned int rough_met_tex, unsigned int position_tex, unsigned int ssao_tex, const Cubemap& irradiance, unsigned int vao)
{
    ZoneScopedN("Shading pass");
    TracyGpuZone("Shading pass");
    GLScopedDebugGroup("Shading pass");

    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClear(GL_COLOR_BUFFER_BIT);

    const Cubemap* skyboxMap = nullptr;
    switch(skybox_choice) {
        case 0:
            skyboxMap = cubemap;
            break;
        case 1:
            skyboxMap = &irradiance;
            break;

        default:
            assert(false);
    }

    if (skyboxMap) {
        glBindVertexArray(cube_vao);
        glUseProgram(skybox_program.id());
        glUniformMatrix4fv(skybox_program.getLoc("viewproj"), 1, GL_FALSE, glm::value_ptr(projMatrix * glm::mat4(glm::mat3(viewMatrix))));
        glUniform1f(skybox_program.getLoc("scale"), 0.5f*(zNear+zFar));
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_CUBE_MAP, skyboxMap->id());
        glUniform1i(skybox_program.getLoc("skybox"), 0);
        glDrawArrays(GL_TRIANGLES, 0, 36);
    }

    static float lightPos[3] = { 4.f, 1.f, 6.f };
    static float lightColor[3] = { 1.f, 1.f, 1.f };
    if (ImGui::CollapsingHeader("Point light")) {
        ImGui::ColorEdit3("Light color", lightColor);
        ImGui::DragFloat3("Light position", lightPos, 0.001f, -10.f, 10.f);
        ImGui::Separator();
    }

    glUseProgram(shading_program.id());
    glUniform1i(shading_program.getLoc("pointLightsNum"), 1);
    glUniform3fv(shading_program.getLoc("pointLights[0].position"), 1, lightPos);
    glUniform3fv(shading_program.getLoc("pointLights[0].color"), 1, lightColor);
    glm::vec3 cameraPosition = glm::vec3(glm::inverse(viewMatrix)[3]);
    glUniform3fv(shading_program.getLoc("camPos"), 1, glm::value_ptr(cameraPosition));
    glUniform1i(shading_program.getLoc("albedotex"), 0);
    glUniform1i(shading_program.getLoc("normaltex"), 1);
    glUniform1i(shading_program.getLoc("depthtex"), 2);
    glUniform1i(shading_program.getLoc("roughmettex"), 3);
    glUniform1i(shading_program.getLoc("positiontex"), 4);
    glUniform1i(shading_program.getLoc("ssaotex"), 5);
    glUniform1i(shading_program.getLoc("irradianceMap"), 6);
    glUniform3f(shading_program.getLoc("sunLight.dir"), lightDir.x, lightDir.y, lightDir.z);
    glUniform3f(shading_program.getLoc("sunLight.color"), 1.f, 1.f, 1.f);
    glUniformMatrix4fv(shading_program.getLoc("lightSpaceMatrix"), 1, GL_FALSE, glm::value_ptr(lightMatrix));
    glUniform1f(shading_program.getLoc("ambientIntensity"), ambient_intensity);
    glUniform1f(shading_program.getLoc("shadowBias"), shadow_bias);
    glUniform1f(shading_program.getLoc("use_pcf"), use_pcf);
    glUniform1ui(shading_program.getLoc("frame_num"), frame_num);
    glUniform1f(shading_program.getLoc("pcf_radius"), pcf_radius);

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, albedo_tex);
    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normal_tex);
    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, shadow_tex);
    glActiveTexture(GL_TEXTURE3);
    glBindTexture(GL_TEXTURE_2D, rough_met_tex);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_2D, position_tex);
    glActiveTexture(GL_TEXTURE5);
    glBindTexture(GL_TEXTURE_2D, ssao_tex);
    glActiveTexture(GL_TEXTURE6);
    glBindTexture(GL_TEXTURE_CUBE_MAP, irradiance.id());
    
    glBindVertexArray(vao);
    glDrawArrays(GL_TRIANGLES, 0, 3);

    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    frame_num++;
}